

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O1

void update_disp(void)

{
  int n;
  long lVar1;
  int *piVar2;
  long lVar3;
  int *piVar4;
  
  piVar4 = &missiles[0][0].count;
  lVar1 = 0;
  do {
    n = (int)lVar1;
    if (robots[lVar1].status != 0) {
      plot_robot(n);
      robot_stat(n);
    }
    lVar3 = 0;
    piVar2 = piVar4;
    do {
      if (((missile *)(piVar2 + -8))->stat == 2) {
        plot_exp(n,(int)lVar3);
        if (*piVar2 < 1) {
          ((missile *)(piVar2 + -8))->stat = 0;
        }
        else {
          *piVar2 = *piVar2 + -1;
        }
      }
      else if (((missile *)(piVar2 + -8))->stat == 1) {
        plot_miss(n,(int)lVar3);
      }
      lVar3 = lVar3 + 1;
      piVar2 = piVar2 + 0xb;
    } while (lVar3 == 1);
    lVar1 = lVar1 + 1;
    piVar4 = piVar4 + 0x16;
  } while (lVar1 != 4);
  return;
}

Assistant:

void update_disp()
{
   int i, j;

  /* plot each live robot and update status */
  for (i = 0; i < MAXROBOTS; i++) {
    if (robots[i].status != DEAD) {
      plot_robot(i);
      robot_stat(i);
    }
    /* plot each missile */
    for (j = 0; j < MIS_ROBOT; j++) {
      switch (missiles[i][j].stat) {
	case AVAIL:
	  break;
	case FLYING:
	  plot_miss(i,j);
	  break;
	case EXPLODING:
	  plot_exp(i,j);
	  count_miss(i,j);
	  break;
	default:
	  break;
      }
    }
  }
}